

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O3

int32_t parse_frame(int64_t k)

{
  Btor2Line *pBVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar5;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 b;
  int64_t iVar6;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar7;
  size_t sVar8;
  BtorSimBitVector *pBVar9;
  BtorSimBitVector *pBVar10;
  BtorSimArrayModel *pBVar11;
  ulong extraout_RAX;
  int64_t *piVar12;
  char *unaff_RBX;
  long lVar13;
  char *pcVar14;
  Btor2Line *pBVar15;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar16;
  char *m;
  char *pcVar17;
  char *pcVar18;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 unaff_R12;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 unaff_R14;
  ulong uVar19;
  BtorSimState BVar20;
  int32_t ch;
  BtorSimState tmp;
  int local_54;
  BtorSimState local_50;
  Btor2Line *local_40;
  pointer local_38;
  
  if (0 < k) {
    transition(k);
  }
  msg(2,"parsing frame %ld",k);
  local_54 = next_char();
  if (local_54 != -1) {
    if (local_54 == 0x23) {
      iVar6 = parse_unsigned_number(&local_54);
      if ((iVar6 != k) || (local_54 != 10)) {
LAB_00111dae:
        pcVar18 = "missing \'#%ld\' state part header of frame %ld";
        aVar5 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)k;
LAB_00111dbb:
        parse_error(pcVar18,aVar5.bv_state,k);
        iVar3 = next_char();
        if (iVar3 == 0x30) {
          uVar4 = next_char();
          uVar19 = (ulong)uVar4;
          if (uVar4 - 0x30 < 10) {
            do {
              parse_error("unexpected digit \'%c\' after \'0\'",uVar19 & 0xffffffff);
LAB_00111e80:
              pcVar18 = "expected digit";
LAB_00111e69:
              parse_error(pcVar18);
              uVar19 = extraout_RAX;
            } while( true );
          }
          uVar19 = 0;
        }
        else {
          if (9 < iVar3 - 0x30U) goto LAB_00111e80;
          uVar19 = (ulong)(iVar3 - 0x30U);
          uVar4 = next_char();
          while (uVar2 = uVar4 - 0x30, uVar2 < 10) {
            if (0xccccccccccccccc < (long)uVar19) {
              pcVar18 = "number too large (too many digits)";
              goto LAB_00111e69;
            }
            if ((long)((ulong)uVar2 ^ 0x7fffffffffffffff) < (long)(uVar19 * 10)) {
              pcVar18 = "number too large";
              goto LAB_00111e69;
            }
            uVar19 = uVar19 * 10 + (ulong)uVar2;
            uVar4 = next_char();
          }
        }
        *(uint *)pcVar18 = uVar4;
        return (int32_t)uVar19;
      }
      aVar5 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)parse_assignment();
      pcVar18 = _ZL11array_index_0;
      pcVar17 = _ZL11array_index_1;
      iVar6 = charno;
      while (_ZL11array_index_0 = pcVar18, _ZL11array_index_1 = pcVar17, charno = iVar6,
            -1 < (long)aVar5.bv_state) {
        charno = 1;
        lineno = lineno + -1;
        aVar7 = aVar5;
        if ((long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 <= (long)aVar5.bv_state) goto LAB_00111d35;
        pBVar15 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)aVar5];
        if ((pBVar15->sort).tag == BTOR2_TAG_SORT_bitvec) {
          if (_ZL6symbol_1 == _ZL6symbol_0) {
            msg(4,"state assignment \'%ld %s\' at time frame %ld",aVar5.bv_state,_ZL8constant_0,k);
          }
          else {
            msg(4,"state assignment \'%ld %s %s\' at time frame %ld",aVar5.bv_state,_ZL8constant_0,
                _ZL6symbol_0,k);
          }
          pcVar18 = _ZL8constant_0;
          sVar8 = strlen(_ZL8constant_0);
          if (sVar8 != (pBVar15->sort).field_3.bitvec.width) goto LAB_00111d00;
          unaff_RBX = (char *)0x0;
        }
        else {
          if (pcVar17 == pcVar18) {
            if (pcVar17 == _ZL11array_index_2) {
              pcVar17 = (char *)realloc(pcVar18,1);
              if (pcVar17 != (char *)0x0) {
                _ZL11array_index_2 = pcVar17 + 1;
                _ZL11array_index_0 = pcVar17;
                goto LAB_001115fd;
              }
LAB_00111da9:
              parse_frame();
              goto LAB_00111dae;
            }
LAB_001115fd:
            unaff_RBX = _ZL11array_index_2;
            pcVar18 = _ZL11array_index_0;
            pcVar14 = pcVar17 + 1;
            _ZL11array_index_1 = pcVar14;
            *pcVar17 = '*';
            if (pcVar14 == unaff_RBX) {
              sVar8 = ((long)unaff_RBX - (long)pcVar18) * 2;
              lVar13 = (long)unaff_RBX - (long)pcVar18;
              if (lVar13 == 0) {
                sVar8 = 1;
              }
              pcVar18 = (char *)realloc(pcVar18,sVar8);
              if (pcVar18 == (char *)0x0) {
                parse_frame();
                goto LAB_00111da9;
              }
              pcVar14 = pcVar18 + lVar13;
              _ZL11array_index_2 = pcVar18 + sVar8;
              unaff_RBX = pcVar14;
              _ZL11array_index_0 = pcVar18;
            }
            _ZL11array_index_1 = pcVar14 + 1;
            *pcVar14 = '\0';
          }
          if (_ZL6symbol_1 == _ZL6symbol_0) {
            pcVar14 = "state assignment \'%ld [%s] %s\' at time frame %ld";
            pcVar17 = (char *)k;
          }
          else {
            pcVar14 = "state assignment \'%ld [%s] %s %s\' at time frame %ld";
            pcVar17 = _ZL6symbol_0;
          }
          msg(4,pcVar14,aVar5.bv_state,pcVar18,_ZL8constant_0,pcVar17);
          unaff_R14.bv_state =
               (BtorSimBitVector *)
               btor2parser_get_line_by_id(model,(pBVar15->sort).field_3.array.index);
          local_40 = pBVar15;
          lVar13 = btor2parser_get_line_by_id(model,(pBVar15->sort).field_3.array.element);
          if ((long)_ZL11array_index_1 - (long)_ZL11array_index_0 == 2) {
            unaff_RBX = (char *)CONCAT71((int7)((ulong)unaff_RBX >> 8),*_ZL11array_index_0 == '*');
          }
          else {
            unaff_RBX = (char *)0x0;
          }
          sVar8 = strlen(_ZL11array_index_0);
          pcVar18 = _ZL8constant_0;
          if (sVar8 != (uint)((unaff_R14.array_state)->data)._M_h._M_element_count &&
              ((ulong)unaff_RBX & 1) == 0) {
            charno = index_columno;
            aVar7 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)(local_40->sort).field_3.array.index
            ;
            pcVar18 = "expected index of width \'%u\'";
            goto LAB_00111cf9;
          }
          sVar8 = strlen(_ZL8constant_0);
          pBVar15 = local_40;
          if (sVar8 != *(uint *)(lVar13 + 0x38)) {
            charno = constant_columno;
            aVar7 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)
                    (local_40->sort).field_3.array.element;
            pcVar18 = "expected element of width \'%u\'";
            goto LAB_00111cf9;
          }
          if (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
              super__Vector_impl_data._M_start[local_40->id].field_1.bv_state ==
              (BtorSimBitVector *)0x0) {
            local_38 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pBVar11 = (BtorSimArrayModel *)operator_new(0x58);
            uVar4 = *(uint *)(lVar13 + 0x38);
            pBVar11->index_width =
                 (ulong)(uint)((unaff_R14.array_state)->data)._M_h._M_element_count;
            pBVar11->element_width = (ulong)uVar4;
            pBVar11->random_seed = 0;
            pBVar11->const_init = (BtorSimBitVector *)0x0;
            (pBVar11->data)._M_h._M_buckets = &(pBVar11->data)._M_h._M_single_bucket;
            (pBVar11->data)._M_h._M_bucket_count = 1;
            (pBVar11->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            (pBVar11->data)._M_h._M_element_count = 0;
            (pBVar11->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (pBVar11->data)._M_h._M_rehash_policy._M_next_resize = 0;
            (pBVar11->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            local_38[pBVar15->id].field_1.array_state = pBVar11;
          }
        }
        if ((pBVar15->sort).tag == BTOR2_TAG_SORT_array && ((ulong)unaff_RBX & 1) == 0) {
          unaff_R14.bv_state = btorsim_bv_char_to_bv(_ZL11array_index_0);
          pcVar18 = _ZL8constant_0;
        }
        else {
          unaff_R14.bv_state = (BtorSimBitVector *)0x0;
        }
        pBVar9 = btorsim_bv_char_to_bv(pcVar18);
        if (k == 0) {
          unaff_RBX = (char *)((ulong)unaff_RBX & 0xffffffff);
          pBVar1 = inits.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                   super__Vector_impl_data._M_start[pBVar15->id];
          if ((pBVar1 != (Btor2Line *)0x0) &&
             (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start[pBVar15->id] != (Btor2Line *)0x0)) {
            pcVar18 = "init & next for state %ld";
            msg(4,"init & next for state %ld");
            BVar20 = simulate(pBVar1->args[1]);
            aVar7 = BVar20.field_1;
            local_50.type = BVar20.type;
            local_50.field_1 = aVar7;
            if ((pBVar15->sort).tag == BTOR2_TAG_SORT_bitvec) {
              iVar3 = btorsim_bv_compare(pBVar9,aVar7.bv_state);
              if (iVar3 != 0) {
LAB_00111d94:
                k = pBVar15->id;
                pcVar18 = "incompatible initialized state %ld id %ld";
                goto LAB_00111dbb;
              }
            }
            else {
              if ((char)unaff_RBX == '\0') {
                aVar16 = unaff_R14;
                b.bv_state = BtorSimArrayModel::check(aVar7.array_state,unaff_R14.bv_state);
                aVar7 = aVar16;
              }
              else {
                b.bv_state = btorsim_bv_copy(aVar7.bv_state);
                aVar7 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)pcVar18;
              }
              if ((BtorSimArrayModel *)b.bv_state != (BtorSimArrayModel *)0x0) {
                aVar7 = b;
                iVar3 = btorsim_bv_compare(pBVar9,b.bv_state);
                if (iVar3 != 0) goto LAB_00111d94;
                btorsim_bv_free(b.bv_state);
              }
            }
            BtorSimState::remove(&local_50,(char *)aVar7.bv_state);
          }
          lineno = lineno + 1;
          charno = iVar6;
        }
        else {
          lineno = lineno + 1;
          charno = iVar6;
          if ((0 < k) &&
             (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start[pBVar15->id] != (Btor2Line *)0x0)) {
            pBVar11 = current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                      _M_impl.super__Vector_impl_data._M_start[pBVar15->id].field_1.array_state;
            if ((pBVar15->sort).tag == BTOR2_TAG_SORT_bitvec) {
              iVar3 = btorsim_bv_compare(pBVar9,(BtorSimBitVector *)pBVar11);
              if (iVar3 != 0) {
LAB_00111d84:
                pcVar18 = (char *)pBVar15->id;
                pcVar17 = "incompatible assignment for state %ld id %ld in time frame %ld";
                aVar16 = aVar5;
                goto LAB_00111d29;
              }
            }
            else {
              if ((char)unaff_RBX == '\0') {
                pBVar10 = BtorSimArrayModel::check(pBVar11,unaff_R14.bv_state);
              }
              else {
                pBVar10 = BtorSimArrayModel::get_const_init(pBVar11);
              }
              if (pBVar10 != (BtorSimBitVector *)0x0) {
                iVar3 = btorsim_bv_compare(pBVar9,pBVar10);
                if (iVar3 != 0) goto LAB_00111d84;
                btorsim_bv_free(pBVar10);
              }
            }
          }
        }
        if ((pBVar15->sort).tag == BTOR2_TAG_SORT_bitvec) {
          lVar13 = pBVar15->id;
          msg(5,"updating state %ld",lVar13);
          unaff_R14.bv_state =
               (BtorSimBitVector *)
               (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar13);
          BtorSimState::update((BtorSimState *)unaff_R14.bv_state,pBVar9);
        }
        else {
          local_50.field_1.bv_state = (BtorSimBitVector *)0x0;
          local_50.type = ARRAY;
          if ((char)unaff_RBX == '\0') {
            local_50.field_1 =
                 (anon_union_8_2_8be7de1a_for_BtorSimState_2)
                 BtorSimArrayModel::write
                           (current_state.
                            super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                            super__Vector_impl_data._M_start[pBVar15->id].field_1.array_state,
                            unaff_R14._0_4_,pBVar9,
                            (size_t)current_state.
                                    super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            btorsim_bv_free(unaff_R14.bv_state);
          }
          else {
            local_50.field_1.array_state =
                 BtorSimArrayModel::set_const_init
                           (current_state.
                            super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                            super__Vector_impl_data._M_start[pBVar15->id].field_1.array_state,pBVar9
                           );
          }
          lVar13 = pBVar15->id;
          msg(5,"updating state %ld",lVar13);
          unaff_R14.bv_state =
               (BtorSimBitVector *)
               (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar13);
          BtorSimState::update((BtorSimState *)unaff_R14.bv_state,&local_50);
          btorsim_bv_free(pBVar9);
        }
        aVar5 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)parse_assignment();
        unaff_R12 = aVar5;
        pcVar18 = _ZL11array_index_0;
        pcVar17 = _ZL11array_index_1;
        iVar6 = charno;
      }
      goto LAB_00111a76;
    }
    if (local_54 == 10) {
      columno = last_line_length;
      piVar12 = &lineno;
    }
    else {
      charno = charno + -1;
      piVar12 = &columno;
    }
    *piVar12 = *piVar12 + -1;
  }
  char_saved = 1;
  saved_char = local_54;
LAB_00111a76:
  local_50.type = next_char();
  if (((local_50.type != 0x40) || (iVar6 = parse_unsigned_number((int32_t *)&local_50), iVar6 != k))
     || (local_50.type != 10)) {
    parse_assignment();
  }
  aVar7 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)parse_assignment();
  aVar5 = unaff_R12;
  iVar6 = charno;
  do {
    charno = iVar6;
    if ((long)aVar7.bv_state < 0) {
      if (k == 0) {
        k = 0;
        initialize_states(0);
      }
      initialize_inputs(k,0);
      simulate_step(k,0);
      return found_end_of_witness ^ 1;
    }
    charno = 1;
    lineno = lineno + -1;
    unaff_R14 = aVar7;
    if ((long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 <= (long)aVar7.bv_state) {
      pcVar18 = "less than %ld defined";
      goto LAB_00111cf9;
    }
    pcVar18 = (char *)k;
    if (_ZL11array_index_1 == _ZL11array_index_0) {
      if (_ZL6symbol_1 != _ZL6symbol_0) {
        m = "input assignment \'%ld %s %s\' at time frame %ld";
        pcVar17 = _ZL8constant_0;
        pcVar14 = _ZL6symbol_0;
        goto LAB_00111b5a;
      }
      msg(4,"input assignment \'%ld %s\' at time frame %ld",aVar7.bv_state,_ZL8constant_0,k);
    }
    else {
      pcVar17 = _ZL11array_index_0;
      pcVar14 = _ZL8constant_0;
      if (_ZL6symbol_1 == _ZL6symbol_0) {
        m = "input assignment \'%ld [%s] %s\' at time frame %ld";
      }
      else {
        m = "input assignment \'%ld [%s] %s %s\' at time frame %ld";
        pcVar18 = _ZL6symbol_0;
      }
LAB_00111b5a:
      msg(4,m,aVar7.bv_state,pcVar17,pcVar14,pcVar18);
    }
    pcVar17 = _ZL8constant_0;
    aVar5 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)
            current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
            super__Vector_impl_data._M_start;
    pBVar15 = inputs.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
              super__Vector_impl_data._M_start[(long)aVar7];
    unaff_RBX = (char *)pBVar15->id;
    if (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
        super__Vector_impl_data._M_start[(long)unaff_RBX].type == BITVEC) {
      sVar8 = strlen(_ZL8constant_0);
      if (sVar8 != (pBVar15->sort).field_3.bitvec.width) goto LAB_00111d00;
      pcVar18 = unaff_RBX;
      aVar16 = aVar5;
      if ((((pointer)((long)aVar5.bv_state + unaff_RBX * 0x10))->field_1).bv_state !=
          (BtorSimBitVector *)0x0) {
        do {
          aVar5 = aVar7;
          pcVar17 = "input %ld id %ld assigned twice in frame %ld";
          unaff_RBX = pcVar18;
          unaff_R14 = aVar5;
LAB_00111d29:
          parse_error(pcVar17,aVar5.bv_state,pcVar18,k);
          aVar7 = aVar16;
LAB_00111d35:
          pcVar18 = "less than %ld states defined";
          aVar5 = aVar7;
LAB_00111cf9:
          parse_error(pcVar18,aVar7.bv_state);
LAB_00111d00:
          charno = constant_columno;
          parse_error("expected constant of width \'%u\'");
          pcVar18 = unaff_RBX;
          aVar16 = aVar5;
          aVar7 = unaff_R14;
        } while( true );
      }
      pBVar9 = btorsim_bv_char_to_bv(pcVar17);
      lineno = lineno + 1;
      lVar13 = pBVar15->id;
      charno = iVar6;
      msg(5,"updating state %ld",lVar13);
      BtorSimState::update
                (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar13,pBVar9);
    }
    else {
      pBVar9 = btorsim_bv_char_to_bv(_ZL11array_index_0);
      pBVar10 = btorsim_bv_char_to_bv(_ZL8constant_0);
      lineno = lineno + 1;
      charno = iVar6;
      pBVar11 = (BtorSimArrayModel *)
                BtorSimArrayModel::write
                          (current_state.
                           super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                           super__Vector_impl_data._M_start[pBVar15->id].field_1.array_state,
                           (int)pBVar9,pBVar10,pBVar15->id * 0x10);
      lVar13 = pBVar15->id;
      msg(5,"updating state %ld",lVar13);
      BtorSimState::update
                (current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar13,pBVar11);
    }
    aVar7 = (anon_union_8_2_8be7de1a_for_BtorSimState_2)parse_assignment();
    iVar6 = charno;
  } while( true );
}

Assistant:

static int32_t
parse_frame (int64_t k)
{
  if (k > 0) transition (k);
  msg (2, "parsing frame %" PRId64, k);
  parse_state_part (k);
  parse_input_part (k);
  const int32_t randomize = 0;
  if (!k) initialize_states (randomize);
  initialize_inputs (k, randomize);
  simulate_step (k, randomize);
  return !found_end_of_witness;
}